

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O2

void __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<int>::VertexBufferObject
          (VertexBufferObject<int> *this,Functions *gl,GLenum target,
          vector<int,_std::allocator<int>_> *data)

{
  GLenum GVar1;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  
  this->m_gl = gl;
  this->m_vertex_buffer_object_id = 0;
  this->m_target = target;
  this->m_size = 0;
  (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*gl->genBuffers)(1,&this->m_vertex_buffer_object_id);
  GVar1 = (*this->m_gl->getError)();
  __fd = 0x1646c21;
  __len = 0x14f;
  glu::checkError(GVar1,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                  ,0x14f);
  if (this->m_vertex_buffer_object_id != 0) {
    this->m_size = *(int *)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                   *(int *)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start & 0xfffffffc;
    bind(this,__fd,__addr,__len);
    (*this->m_gl->bufferData)
              (this->m_target,(long)this->m_size,
               (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,0x88e4);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                    ,0x158);
  }
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::VertexBufferObject<T>::VertexBufferObject(const glw::Functions& gl,
																		 const glw::GLenum target, std::vector<T> data)
	: m_gl(gl), m_vertex_buffer_object_id(0), m_target(target), m_size(0)
{
	m_gl.genBuffers(1, &m_vertex_buffer_object_id);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers call failed.");

	if (m_vertex_buffer_object_id)
	{
		m_size = (glw::GLsizei)(sizeof(T) * data.size());

		bind();

		m_gl.bufferData(m_target, m_size, &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferData call failed.");
	}
}